

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O1

uint32 __thiscall
Js::SparseArraySegmentBase::RemoveUndefined
          (SparseArraySegmentBase *this,ScriptContext *scriptContext)

{
  RecyclableObject *libraryUndefined;
  undefined8 uVar1;
  code *pcVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Type *pTVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  uint local_34;
  
  if (this->length == 0) {
    local_34 = 0;
  }
  else {
    libraryUndefined =
         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .undefinedValue.ptr;
    uVar10 = this->length - 1;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_34 = 0;
    uVar6 = 0;
    do {
      bVar12 = (uint)uVar6 < uVar10;
      if (!bVar12 && (uint)uVar6 != uVar10) break;
      uVar8 = (ulong)uVar10;
      if (bVar12) {
        uVar7 = uVar6 & 0xffffffff;
        do {
          if (*(undefined1 **)(&this[1].left + uVar7 * 2) == &DAT_40002fff80002) {
            bVar13 = true;
          }
          else {
            BVar3 = JavascriptOperators::IsUndefinedObject
                              (*(undefined1 **)(&this[1].left + uVar7 * 2),libraryUndefined);
            bVar13 = BVar3 != 0;
            local_34 = local_34 + bVar13;
          }
          uVar6 = uVar7;
          if (bVar13) break;
          uVar7 = uVar7 + 1;
          bVar12 = uVar7 < uVar8;
          uVar6 = uVar8;
        } while (uVar7 != uVar8);
      }
      uVar5 = (uint)uVar6;
      bVar13 = uVar5 < uVar10;
      uVar11 = uVar10;
      if (bVar13) {
        pTVar9 = &this[1].left + uVar8 * 2;
        do {
          if (*(undefined1 **)pTVar9 == &DAT_40002fff80002) {
            bVar14 = true;
          }
          else {
            BVar3 = JavascriptOperators::IsUndefinedObject(*(undefined1 **)pTVar9,libraryUndefined);
            bVar14 = BVar3 != 0;
            local_34 = local_34 + bVar14;
          }
          if (!bVar14) {
            uVar1 = *(undefined8 *)pTVar9;
            Memory::Recycler::WBSetBit((char *)(&this[1].left + (uVar6 & 0xffffffff) * 2));
            *(undefined8 *)(&this[1].left + (uVar6 & 0xffffffff) * 2) = uVar1;
            Memory::RecyclerWriteBarrierManager::WriteBarrier
                      (&this[1].left + (uVar6 & 0xffffffff) * 2);
            uVar6 = (ulong)(uVar5 + 1);
            goto LAB_00d5e54f;
          }
          uVar10 = uVar10 - 1;
          pTVar9 = pTVar9 + -2;
          bVar13 = uVar5 < uVar10;
          uVar11 = uVar5;
        } while (bVar13);
      }
      if (uVar5 != uVar11) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                     ,0x6f,"(i == j)","i == j");
        if (!bVar14) goto LAB_00d5e6c0;
        *puVar4 = 0;
      }
      uVar10 = uVar11;
      if (bVar12) {
LAB_00d5e54f:
        uVar10 = uVar10 - 1;
      }
      else {
        if (*(undefined1 **)(&this[1].left + (ulong)uVar11 * 2) == &DAT_40002fff80002) {
          bVar12 = true;
        }
        else {
          BVar3 = JavascriptOperators::IsUndefinedObject
                            (*(undefined1 **)(&this[1].left + (ulong)uVar11 * 2),libraryUndefined);
          bVar12 = BVar3 != 0;
          local_34 = local_34 + bVar12;
        }
        if (bVar12) goto LAB_00d5e54f;
      }
    } while (bVar13);
    if (uVar10 != this->length - 1) {
      uVar10 = uVar10 + 1;
      if (this->length <= uVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                     ,0x7b,"(newLen < length)","newLen < length");
        if (!bVar12) goto LAB_00d5e6c0;
        *puVar4 = 0;
      }
      if (this->length - uVar10 < local_34) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                     ,0x7c,"(countUndefined <= length - newLen)",
                                     "countUndefined <= length - newLen");
        if (!bVar12) goto LAB_00d5e6c0;
        *puVar4 = 0;
      }
      SparseArraySegment<void_*>::Truncate((SparseArraySegment<void_*> *)this,uVar10 + this->left);
    }
    if (this->size < this->length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                   ,0x80,"(length <= size)","length <= size");
      if (!bVar12) {
LAB_00d5e6c0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  return local_34;
}

Assistant:

uint32 SparseArraySegmentBase::RemoveUndefined(ScriptContext* scriptContext)
    {
        SparseArraySegment<Var> *_this = (SparseArraySegment<Var>*)this;
        // Shortcut length==0, otherwise the code below will AV when left==length==0. (WOOB 1114975)
        if (length == 0)
        {
            return 0;
        }

        //remove undefine values
        RecyclableObject *undefined = scriptContext->GetLibrary()->GetUndefined();

        uint32 i = 0;
        uint32 j = length - 1;
        uint32 countUndefined = 0;

        while (i <= j)
        {
            //get the first null/undefined slot from left
            while (i < j && !IsMissingOrUndefined(_this->elements[i], undefined, countUndefined))
            {
                i++;
            }
            bool iIsMissingOrUndefined = (i < j); // Flag to avoid test again if later j comes down to == i

            //get the first slot which is not null/undefined from the right
            while (i < j && IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
            {
                j--;
            }

            if (i < j)
            {
                //move
                _this->elements[i] = _this->elements[j];
                i++;
                j--;
            }
            else
            {
                Assert(i == j);
                if (iIsMissingOrUndefined || IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
                {
                    j--; // ok if j becomes -1. We'll truncate to length (j + 1).
                }
                break; // done
            }
        }

        if (j != length - 1) // Truncate if j has changed
        {
            uint32 newLen = j + 1;
            Assert(newLen < length);
            Assert(countUndefined <= length - newLen);

            _this->Truncate(left + newLen); // Truncate to new length (also clears moved elements)
        }
        AssertOrFailFast(length <= size);

        return countUndefined;
    }